

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Widget::~Widget(Widget *this)

{
  ~Widget((Widget *)&this[-1].arrow2);
  return;
}

Assistant:

Q_OBJECT

public:
	Widget()
	{
		layout = new QVBoxLayout( this );

		QHBoxLayout * h = new QHBoxLayout;

		arrow = new QtMWidgets::NavigationArrow(
			QtMWidgets::NavigationArrow::Right, this );

		arrow2 = new QtMWidgets::NavigationArrow(
			QtMWidgets::NavigationArrow::Bottom, this );

		h->addWidget( arrow );
		h->addWidget( arrow2 );

		layout->addLayout( h );

		QHBoxLayout * hbox = new QHBoxLayout;

		QPushButton * change = new QPushButton( tr( "Change Direction" ), this );
		hbox->addWidget( change );
		connect( change, SIGNAL( clicked() ), this, SLOT( changeDirection() ) );

		QPushButton * ani = new QPushButton( tr( "Animate" ), this );
		hbox->addWidget( ani );
		connect( ani, SIGNAL( clicked() ), this, SLOT( animate() ) );

		layout->addLayout( hbox );

		resize( 300, 150 );
	}